

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O2

void __thiscall
ktx::OptionsEncodeBasis<false>::process
          (OptionsEncodeBasis<false> *this,Options *param_1,ParseResult *args,Reporter *report)

{
  size_t sVar1;
  BasisCodec BVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OptionValue *pOVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  allocator<char> local_81;
  string local_80;
  string codec_option;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&codec_option,"encode",(allocator<char> *)&local_80);
  pOVar6 = cxxopts::ParseResult::operator[](args,&codec_option);
  BVar2 = validateBasisCodec(this,pOVar6);
  this->codec = BVar2;
  if (BVar2 - BasisLZ < 2) {
    pOVar6 = cxxopts::ParseResult::operator[](args,&codec_option);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
    std::__cxx11::string::string((string *)&local_40,(string *)pbVar7);
    to_lower_copy(&local_80,&local_40);
    std::__cxx11::string::operator=((string *)&this->codecName,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    if (BVar2 == NONE) goto LAB_0015b602;
    pOVar6 = cxxopts::ParseResult::operator[](args,&codec_option);
    pbVar7 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar6);
    Reporter::fatal_usage<char_const(&)[28],std::__cxx11::string_const&>
              (report,(char (*) [28])"Invalid encode codec: \"{}\".",pbVar7);
  }
  if (this->codec == UASTC) {
    (this->super_ktxBasisParams).uastc = true;
  }
LAB_0015b602:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kCLevel,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZArg(this,report,kCLevel);
    uVar3 = captureCodecOption<unsigned_int>(this,args,kCLevel);
    (this->super_ktxBasisParams).compressionLevel = uVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kQLevel,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZArg(this,report,kQLevel);
    uVar4 = captureCodecOption<unsigned_int>(this,args,kQLevel);
    uVar3 = (this->qualityLevel).min;
    uVar5 = (this->qualityLevel).max;
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    if (uVar4 < uVar3) {
      uVar5 = uVar3;
    }
    *(this->qualityLevel).option = uVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kNoEndpointRdo,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZArg(this,report,kNoEndpointRdo);
    captureCodecOption(this,kNoEndpointRdo);
    (this->super_ktxBasisParams).noEndpointRDO = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kNoSelectorRdo,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZArg(this,report,kNoSelectorRdo);
    captureCodecOption(this,kNoSelectorRdo);
    (this->super_ktxBasisParams).noSelectorRDO = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kMaxEndpoints,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZEndpointRDOArg(this,report,kMaxEndpoints);
    uVar4 = captureCodecOption<unsigned_int>(this,args,kMaxEndpoints);
    uVar3 = (this->maxEndpoints).min;
    uVar5 = (this->maxEndpoints).max;
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    if (uVar4 < uVar3) {
      uVar5 = uVar3;
    }
    *(this->maxEndpoints).option = uVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,kEndpointRdoThreshold,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZEndpointRDOArg(this,report,kEndpointRdoThreshold);
    fVar8 = captureCodecOption<float>(this,args,kEndpointRdoThreshold);
    (this->super_ktxBasisParams).endpointRDOThreshold = fVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kMaxSelectors,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZSelectorRDOArg(this,report,kMaxSelectors);
    uVar4 = captureCodecOption<unsigned_int>(this,args,kMaxSelectors);
    uVar3 = (this->maxSelectors).min;
    uVar5 = (this->maxSelectors).max;
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    if (uVar4 < uVar3) {
      uVar5 = uVar3;
    }
    *(this->maxSelectors).option = uVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,kSelectorRdoThreshold,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateBasisLZSelectorRDOArg(this,report,kSelectorRdoThreshold);
    fVar8 = captureCodecOption<float>(this,args,kSelectorRdoThreshold);
    (this->super_ktxBasisParams).selectorRDOThreshold = fVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcQuality,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCArg(this,report,kUastcQuality);
    uVar5 = captureCodecOption<unsigned_int>(this,args,kUastcQuality);
    uVar3 = 4;
    if (uVar5 < 4) {
      uVar3 = uVar5;
    }
    (this->super_ktxBasisParams).uastcFlags = uVar3 | 0xfffffff0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdo,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCArg(this,report,kUastcRdo);
    captureCodecOption(this,kUastcRdo);
    (this->super_ktxBasisParams).uastcRDO = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdoL,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoL);
    fVar9 = captureCodecOption<float>(this,args,kUastcRdoL);
    fVar8 = (this->uastcRDOQualityScalar).min;
    fVar10 = (this->uastcRDOQualityScalar).max;
    if (fVar9 <= fVar10) {
      fVar10 = fVar9;
    }
    uVar3 = -(uint)(fVar9 < fVar8);
    *(this->uastcRDOQualityScalar).option = (float)(uVar3 & (uint)fVar8 | ~uVar3 & (uint)fVar10);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdoD,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoD);
    uVar4 = captureCodecOption<unsigned_int>(this,args,kUastcRdoD);
    uVar3 = (this->uastcRDODictSize).min;
    uVar5 = (this->uastcRDODictSize).max;
    if (uVar4 <= uVar5) {
      uVar5 = uVar4;
    }
    if (uVar4 < uVar3) {
      uVar5 = uVar3;
    }
    *(this->uastcRDODictSize).option = uVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdoB,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoB);
    fVar9 = captureCodecOption<float>(this,args,kUastcRdoB);
    fVar8 = (this->uastcRDOMaxSmoothBlockErrorScale).min;
    fVar10 = (this->uastcRDOMaxSmoothBlockErrorScale).max;
    if (fVar9 <= fVar10) {
      fVar10 = fVar9;
    }
    uVar3 = -(uint)(fVar9 < fVar8);
    *(this->uastcRDOMaxSmoothBlockErrorScale).option =
         (float)(uVar3 & (uint)fVar8 | ~uVar3 & (uint)fVar10);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdoS,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoS);
    fVar9 = captureCodecOption<float>(this,args,kUastcRdoS);
    fVar8 = (this->uastcRDOMaxSmoothBlockStdDev).min;
    fVar10 = (this->uastcRDOMaxSmoothBlockStdDev).max;
    if (fVar9 <= fVar10) {
      fVar10 = fVar9;
    }
    uVar3 = -(uint)(fVar9 < fVar8);
    *(this->uastcRDOMaxSmoothBlockStdDev).option =
         (float)(uVar3 & (uint)fVar8 | ~uVar3 & (uint)fVar10);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdoF,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoF);
    captureCodecOption(this,kUastcRdoF);
    (this->super_ktxBasisParams).uastcRDODontFavorSimplerModes = true;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,kUastcRdoM,&local_81);
  pOVar6 = cxxopts::ParseResult::operator[](args,&local_80);
  sVar1 = pOVar6->m_count;
  std::__cxx11::string::~string((string *)&local_80);
  if (sVar1 != 0) {
    validateUASTCRDOArg(this,report,kUastcRdoM);
    captureCodecOption(this,kUastcRdoM);
    (this->super_ktxBasisParams).uastcRDONoMultithreading = true;
  }
  std::__cxx11::string::~string((string *)&codec_option);
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        std::string codec_option{"encode"};

        if (ENCODE_CMD) {
            codec_option = "codec";
        }

        codec = validateBasisCodec(args[codec_option]);
        switch (codec) {
        case BasisCodec::NONE:
            // Not specified
            break;

        case BasisCodec::BasisLZ:
        case BasisCodec::UASTC:
            codecName = to_lower_copy(args[codec_option].as<std::string>());
            break;

        default:
            report.fatal_usage("Invalid encode codec: \"{}\".", args[codec_option].as<std::string>());
            break;
        }

        if (codec == BasisCodec::UASTC) {
            uastc = 1;
        }

        // NOTE: The order of the validation below matters

        if (args[kCLevel].count()) {
            validateBasisLZArg(report, kCLevel);
            compressionLevel = captureCodecOption<uint32_t>(args, kCLevel);;
        }

        if (args[kQLevel].count()) {
            validateBasisLZArg(report, kQLevel);
            qualityLevel = captureCodecOption<uint32_t>(args, kQLevel);
        }

        if (args[kNoEndpointRdo].count()) {
            validateBasisLZArg(report, kNoEndpointRdo);
            captureCodecOption(kNoEndpointRdo);
            noEndpointRDO = 1;
        }

        if (args[kNoSelectorRdo].count()) {
            validateBasisLZArg(report, kNoSelectorRdo);
            captureCodecOption(kNoSelectorRdo);
            noSelectorRDO = 1;
        }

        if (args[kMaxEndpoints].count()) {
            validateBasisLZEndpointRDOArg(report, kMaxEndpoints);
            maxEndpoints = captureCodecOption<uint32_t>(args, kMaxEndpoints);
        }

        if (args[kEndpointRdoThreshold].count()) {
            validateBasisLZEndpointRDOArg(report, kEndpointRdoThreshold);
            endpointRDOThreshold = captureCodecOption<float>(args, kEndpointRdoThreshold);
        }

        if (args[kMaxSelectors].count()) {
            validateBasisLZSelectorRDOArg(report, kMaxSelectors);
            maxSelectors = captureCodecOption<uint32_t>(args, kMaxSelectors);
        }

        if (args[kSelectorRdoThreshold].count()) {
            validateBasisLZSelectorRDOArg(report, kSelectorRdoThreshold);
            selectorRDOThreshold = captureCodecOption<float>(args, kSelectorRdoThreshold);
        }

        if (args[kUastcQuality].count()) {
            validateUASTCArg(report, kUastcQuality);
            uint32_t level = captureCodecOption<uint32_t>(args, kUastcQuality);
            level = std::clamp<uint32_t>(level, 0, KTX_PACK_UASTC_MAX_LEVEL);
            uastcFlags = (unsigned int)~KTX_PACK_UASTC_LEVEL_MASK;
            uastcFlags |= level;
        }

        if (args[kUastcRdo].count()) {
            validateUASTCArg(report, kUastcRdo);
            captureCodecOption(kUastcRdo);
            uastcRDO = 1;
        }

        if (args[kUastcRdoL].count()) {
            validateUASTCRDOArg(report, kUastcRdoL);
            uastcRDOQualityScalar = captureCodecOption<float>(args, kUastcRdoL);
        }

        if (args[kUastcRdoD].count()) {
            validateUASTCRDOArg(report, kUastcRdoD);
            uastcRDODictSize = captureCodecOption<uint32_t>(args, kUastcRdoD);
        }

        if (args[kUastcRdoB].count()) {
            validateUASTCRDOArg(report, kUastcRdoB);
            uastcRDOMaxSmoothBlockErrorScale = captureCodecOption<float>(args, kUastcRdoB);
        }

        if (args[kUastcRdoS].count()) {
            validateUASTCRDOArg(report, kUastcRdoS);
            uastcRDOMaxSmoothBlockStdDev = captureCodecOption<float>(args, kUastcRdoS);
        }

        if (args[kUastcRdoF].count()) {
            validateUASTCRDOArg(report, kUastcRdoF);
            captureCodecOption(kUastcRdoF);
            uastcRDODontFavorSimplerModes = 1;
        }

        if (args[kUastcRdoM].count()) {
            validateUASTCRDOArg(report, kUastcRdoM);
            captureCodecOption(kUastcRdoM);
            uastcRDONoMultithreading = 1;
        }
    }